

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall kratos::Const::add_sink(Const *this,shared_ptr<kratos::AssignStmt> *stmt)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  Generator *pGVar4;
  StmtException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  string local_70;
  element_type *local_50;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_48;
  allocator_type local_21;
  long *plVar2;
  
  iVar1 = (*(((stmt->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             left_->super_IRNode)._vptr_IRNode[0xd])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    lVar3 = (**(code **)(*plVar2 + 0x20))(plVar2);
    if ((lVar3 != 0) && (*(int *)(lVar3 + 0x48) == 0)) {
      pGVar4 = (Generator *)__dynamic_cast(lVar3,&IRNode::typeinfo,&Generator::typeinfo,0);
      (this->super_Var).generator_ = pGVar4;
    }
    return;
  }
  this_00 = (StmtException *)__cxa_allocate_exception(0x10);
  local_48.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bVar5 = fmt::v7::to_string_view<char,_0>("Unable to find left hand side generator");
  format_str.data_ = bVar5.size_;
  format_str.size_ = 0;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_48;
  fmt::v7::detail::vformat_abi_cxx11_(&local_70,(detail *)bVar5.data_,format_str,args);
  local_50 = (stmt->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_50;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_48,__l,&local_21);
  StmtException::StmtException(this_00,&local_70,&local_48);
  __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Const::add_sink(const std::shared_ptr<AssignStmt> &stmt) {
    auto *left = stmt->left();
    // if it's a port, we change the constant's generator to that of port
    auto *generator = left->generator();
    if (!generator)
        throw StmtException(::format("Unable to find left hand side generator"), {stmt.get()});
    auto *parent = generator->parent();
    if (parent && parent->ir_node_kind() == GeneratorKind) {
        auto *gen = dynamic_cast<Generator *>(parent);
        this->generator_ = gen;
    }
}